

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

int __thiscall Patch::copy(Patch *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  value_type __x;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppNVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src_01;
  value_type dst_00;
  Node *node;
  Node *new_root;
  Patch *this_local;
  
  node = (Node *)0x0;
  new_root = (Node *)dst;
  this_local = this;
  if (*(long *)dst != 0) {
    iVar2 = Node::copy(*(Node **)dst,dst,src);
    node = (Node *)CONCAT44(extraout_var,iVar2);
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::clear
              ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8));
    dst_00 = (value_type)&node;
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
              ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8),
               (value_type *)dst_00);
    while (bVar1 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::empty
                             ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ppNVar3 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                          ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8));
      __x = *ppNVar3;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::pop_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8));
      src_01 = src_00;
      if (__x->left != (value_type)0x0) {
        iVar2 = Node::copy(__x->left,(EVP_PKEY_CTX *)dst_00,src_00);
        __x->left = (value_type)CONCAT44(extraout_var_00,iVar2);
        dst_00 = __x;
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8),&__x->left);
        src_01 = extraout_RDX;
      }
      if (__x->right != (Node *)0x0) {
        iVar2 = Node::copy(__x->right,(EVP_PKEY_CTX *)dst_00,src_01);
        __x->right = (Node *)CONCAT44(extraout_var_01,iVar2);
        dst_00 = (value_type)&__x->right;
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8),
                   (value_type *)dst_00);
      }
    }
  }
  Patch(this,node,*(uint32_t *)(dst + 0x38),(bool)((byte)dst[0x3c] & 1));
  return (int)this;
}

Assistant:

Patch Patch::copy() {
  Node *new_root = nullptr;
  if (root) {
    new_root = root->copy();
    node_stack.clear();
    node_stack.push_back(new_root);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left) {
        node->left = node->left->copy();
        node_stack.push_back(node->left);
      }
      if (node->right) {
        node->right = node->right->copy();
        node_stack.push_back(node->right);
      }
    }
  }

  return Patch{new_root, change_count, merges_adjacent_changes};
}